

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O0

Wrench * iDynTree::computeKnownTermsOfEstimationEquationWithoutInternalFT
                   (Model *model,Traversal *modelTraversal,JointPosDoubleArray *jointPos,
                   LinkVelArray *linkVel,LinkAccArray *linkProperAcc,
                   estimateExternalWrenchesBuffers *bufs)

{
  uint uVar1;
  SpatialMomentum *pSVar2;
  uint uVar3;
  Wrench *pWVar4;
  long lVar5;
  long lVar6;
  Transform *pTVar7;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  Wrench *in_RDI;
  LinkVelArray *in_R8;
  LinkAccArray *in_R9;
  undefined1 auVar8 [16];
  long in_stack_00000008;
  Transform visitedLink_X_child;
  IJointConstPtr neighborJoint;
  LinkIndex childIndex;
  LinkIndex neighborIndex;
  uint neigh_i;
  Twist *v;
  SpatialAcc *properAcc;
  SpatialInertia *I;
  LinkConstPtr parentLink;
  LinkIndex visitedLinkIndex;
  LinkConstPtr visitedLink;
  int traversalEl;
  SpatialForceVector local_298 [56];
  Transform local_260 [56];
  Wrench local_228;
  Transform local_1f0 [96];
  undefined1 local_190 [16];
  long *local_180;
  long local_178;
  undefined1 local_170 [16];
  long local_160;
  uint local_158;
  SpatialInertia local_148 [56];
  Twist local_110 [56];
  Wrench local_d8;
  Wrench local_a0;
  SpatialMomentum *local_68;
  undefined8 local_60;
  Twist *local_58;
  long local_50;
  long local_48;
  undefined8 local_40;
  int local_34;
  LinkAccArray *local_30;
  LinkVelArray *local_28;
  undefined8 local_20;
  long local_18;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_34 = iDynTree::Traversal::getNrOfVisitedLinks();
  do {
    local_34 = local_34 + -1;
    if (local_34 < 0) {
      SpatialVector<iDynTree::SpatialForceVector>::Zero();
      iDynTree::Wrench::Wrench(in_RDI,local_298);
      iDynTree::SpatialForceVector::~SpatialForceVector(local_298);
      return in_RDI;
    }
    local_40 = iDynTree::Traversal::getLink(local_18);
    local_48 = iDynTree::Link::getIndex();
    local_50 = iDynTree::Traversal::getParentLink(local_18);
    local_58 = (Twist *)iDynTree::Link::getInertia();
    local_60 = iDynTree::LinkAccArray::operator()(local_30,local_48);
    local_68 = (SpatialMomentum *)iDynTree::LinkVelArray::operator()(local_28,local_48);
    iDynTree::SpatialInertia::operator*((SpatialInertia *)&local_d8,(SpatialAcc *)local_58);
    pSVar2 = local_68;
    iDynTree::SpatialInertia::operator*(local_148,local_58);
    iDynTree::Twist::operator*(local_110,pSVar2);
    iDynTree::Wrench::operator+(&local_a0,&local_d8);
    pWVar4 = (Wrench *)
             iDynTree::LinkWrenches::operator()((LinkWrenches *)(in_stack_00000008 + 0x48),local_48)
    ;
    iDynTree::Wrench::operator=(pWVar4,&local_a0);
    Wrench::~Wrench((Wrench *)0x5454fc);
    Wrench::~Wrench((Wrench *)0x545509);
    SpatialMomentum::~SpatialMomentum((SpatialMomentum *)0x545516);
    Wrench::~Wrench((Wrench *)0x545523);
    local_158 = 0;
    while( true ) {
      uVar1 = local_158;
      uVar3 = iDynTree::Model::getNrOfNeighbors(local_10);
      if (uVar3 <= uVar1) break;
      auVar8 = iDynTree::Model::getNeighbor(local_10,(uint)local_48);
      lVar5 = auVar8._0_8_;
      local_160 = lVar5;
      local_170 = auVar8;
      if (local_50 == 0) {
LAB_005455ce:
        lVar5 = local_10;
        local_178 = local_160;
        auVar8 = iDynTree::Model::getNeighbor(local_10,(uint)local_48);
        local_190 = auVar8;
        local_180 = (long *)iDynTree::Model::getJoint(lVar5);
        pTVar7 = (Transform *)
                 (**(code **)(*local_180 + 0x50))(local_180,local_20,local_48,local_178);
        iDynTree::Transform::Transform(local_1f0,pTVar7);
        pWVar4 = (Wrench *)
                 iDynTree::LinkWrenches::operator()
                           ((LinkWrenches *)(in_stack_00000008 + 0x48),local_48);
        iDynTree::LinkWrenches::operator()((LinkWrenches *)(in_stack_00000008 + 0x48),local_178);
        iDynTree::Transform::operator*(local_260,(Wrench *)local_1f0);
        iDynTree::Wrench::operator+(&local_228,pWVar4);
        pWVar4 = (Wrench *)
                 iDynTree::LinkWrenches::operator()
                           ((LinkWrenches *)(in_stack_00000008 + 0x48),local_48);
        iDynTree::Wrench::operator=(pWVar4,&local_228);
        Wrench::~Wrench((Wrench *)0x545712);
        Wrench::~Wrench((Wrench *)0x54571f);
      }
      else {
        lVar6 = iDynTree::Link::getIndex();
        if (lVar5 != lVar6) goto LAB_005455ce;
      }
      local_158 = local_158 + 1;
    }
    if (local_50 == 0) {
      pWVar4 = (Wrench *)
               iDynTree::LinkWrenches::operator()
                         ((LinkWrenches *)(in_stack_00000008 + 0x48),local_48);
      iDynTree::Wrench::Wrench(in_RDI,pWVar4);
      return in_RDI;
    }
  } while( true );
}

Assistant:

Wrench computeKnownTermsOfEstimationEquationWithoutInternalFT(const Model& model,
                                                              const Traversal& modelTraversal,
                                                              const JointPosDoubleArray & jointPos,
                                                              const LinkVelArray& linkVel,
                                                              const LinkAccArray& linkProperAcc,
                                                                    estimateExternalWrenchesBuffers& bufs)
{
    // First compute the known term of the estimation for each link:
    // this loop is similar to the dynamic phase of the RNEA
    // \todo pimp up performance as done in RNEADynamicPhase
     for(int traversalEl = modelTraversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
     {
         LinkConstPtr visitedLink = modelTraversal.getLink(traversalEl);
         LinkIndex    visitedLinkIndex = visitedLink->getIndex();
         LinkConstPtr parentLink  = modelTraversal.getParentLink(traversalEl);

         const iDynTree::SpatialInertia & I = visitedLink->getInertia();
         const iDynTree::SpatialAcc     & properAcc = linkProperAcc(visitedLinkIndex);
         const iDynTree::Twist          & v = linkVel(visitedLinkIndex);
         bufs.b_contacts_subtree(visitedLinkIndex) = I*properAcc + v*(I*v);

         // Iterate on childs of visitedLink
         // We obtain all the children as all the neighbors of the link, except
         // for its parent
         // \todo TODO this point is definitly Tree-specific
         // \todo TODO this "get child" for is duplicated in the code, we
         //            should try to consolidate it
         for(unsigned int neigh_i=0; neigh_i < model.getNrOfNeighbors(visitedLinkIndex); neigh_i++)
         {
             LinkIndex neighborIndex = model.getNeighbor(visitedLinkIndex,neigh_i).neighborLink;
             if( !parentLink || neighborIndex != parentLink->getIndex() )
             {
                 LinkIndex childIndex = neighborIndex;
                 IJointConstPtr neighborJoint = model.getJoint(model.getNeighbor(visitedLinkIndex,neigh_i).neighborJoint);
                 Transform visitedLink_X_child = neighborJoint->getTransform(jointPos,visitedLinkIndex,childIndex);

                 // One term of the sum in Equation 5.20 in Featherstone 2008
                 bufs.b_contacts_subtree(visitedLinkIndex) = bufs.b_contacts_subtree(visitedLinkIndex)
                                                            + visitedLink_X_child*bufs.b_contacts_subtree(childIndex);
             }
         }

         if( parentLink == 0 )
         {
             // If the visited link is the base of the submodel, the
             // computed known terms is the known term of the submodel itself
             return bufs.b_contacts_subtree(visitedLinkIndex);
         }
     }

     assert(false);
     return Wrench::Zero();
}